

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O3

int AF_A_MinotaurRoam(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClass *pPVar6;
  char cVar7;
  AMinotaurFriend *self1;
  AActor *actor;
  VMValue *pVVar8;
  char *__assertion;
  FString *this;
  long lVar9;
  bool bVar10;
  bool bVar11;
  VMValue params [3];
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  undefined4 extraout_var_00;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005eee45;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_005eebb6:
        actor = (AActor *)0x0;
        pVVar8 = param;
        uVar4 = numparam;
      }
      else {
        pPVar5 = (actor->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
          (actor->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar10 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar5 == pPVar6;
        if (!bVar11 && !bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar6) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar4 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005eee45;
        }
      }
      pPVar6 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005eec7d;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005eee35;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar4,ret);
              puVar2[1] = pPVar5;
            }
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar6 && bVar10) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar10 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar6) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005eee45;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005eee35;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005eec7d:
        actor->RenderStyle = LegacyRenderStyles[1];
        pPVar5 = AMinotaurFriend::RegistrationInfo.MyClass;
        pPVar6 = (actor->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
          pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar3);
          (actor->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar5 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar5) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (((bVar10) && (-1 < *(int *)&actor->field_0x49c)) &&
           (0x36a < level.maptime - *(int *)&actor->field_0x49c)) {
          local_74.Index = 0;
          local_70.Degrees = 0.0;
          P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,1000000,&local_74,0,&local_70);
        }
        else {
          uVar4 = FRandom::GenRand32(&pr_minotaurroam);
          if ((uVar4 & 0xfe) < 0x1e) {
            local_68.field_1.atag = 1;
            local_68.field_3.Type = '\x03';
            local_50 = 1;
            local_4c = 3;
            local_48.Chars = (char *)0x0;
            local_40 = 8;
            local_3c[0] = 3;
            local_68.field_1.a = actor;
            local_58 = actor;
            VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,
                               (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0)
            ;
            lVar9 = -0x30;
            this = &local_48;
            do {
              if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
                FString::~FString(this);
              }
              this = this + -2;
              lVar9 = lVar9 + 0x10;
            } while (lVar9 != 0);
          }
          uVar4 = FRandom::GenRand32(&pr_minotaurroam);
          if ((uVar4 & 0xfe) < 6) {
            uVar4 = FRandom::GenRand32(&pr_minotaurroam);
            actor->movedir = (byte)uVar4 & 7;
            FaceMovementDirection(actor);
          }
          bVar10 = P_Move(actor);
          if (!bVar10) {
            uVar4 = FRandom::GenRand32(&pr_minotaurroam);
            cVar7 = '\x01';
            if ((uVar4 & 1) == 0) {
              cVar7 = '\a';
            }
            actor->movedir = cVar7 + actor->movedir & 7;
            FaceMovementDirection(actor);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005eee45;
    }
    if (actor == (AActor *)0x0) goto LAB_005eebb6;
  }
LAB_005eee35:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005eee45:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurRoam)
{
	PARAM_ACTION_PROLOGUE;

	// In case pain caused him to skip his fade in.
	self->RenderStyle = STYLE_Normal;

	if (self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

		if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
		{
			P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
			return 0;
		}
	}

	if (pr_minotaurroam() < 30)
		CALL_ACTION(A_MinotaurLook, self);		// adjust to closest target

	if (pr_minotaurroam() < 6)
	{
		//Choose new direction
		self->movedir = pr_minotaurroam() % 8;
		FaceMovementDirection (self);
	}
	if (!P_Move(self))
	{
		// Turn
		if (pr_minotaurroam() & 1)
			self->movedir = (self->movedir + 1) % 8;
		else
			self->movedir = (self->movedir + 7) % 8;
		FaceMovementDirection (self);
	}
	return 0;
}